

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_52::crashHandler(anon_unknown_52 *this,int signo,siginfo_t *info,void *context)

{
  ArrayPtr<void_*const> trace;
  char *__n;
  void *__buf;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> trace_00;
  ArrayPtr<void_*const> AVar1;
  char *pcVar2;
  size_t in_stack_fffffffffffffe78;
  undefined1 local_17d;
  int signo_local;
  Array<char> local_178;
  char *local_160;
  String message;
  Array<char> local_140;
  void *traceSpace [32];
  
  space.size_ = 2;
  space.ptr = (void **)0x20;
  signo_local = (int)this;
  AVar1 = getStackTrace((kj *)traceSpace,space,(uint)context);
  trace_00.ptr = (void **)AVar1.size_;
  local_160 = strsignal((int)this);
  trace.size_ = in_stack_fffffffffffffe78;
  trace.ptr = (void **)0x21b740;
  stringifyStackTraceAddresses(trace);
  pcVar2 = (char *)0x21b753;
  trace_00.size_ = (size_t)context;
  stringifyStackTrace((String *)&local_140,(kj *)AVar1.ptr,trace_00);
  local_17d = 10;
  __n = ": ";
  str<char_const(&)[22],int&,char_const(&)[3],char*,char_const(&)[9],kj::String,kj::String,char>
            (&message,(kj *)"*** Received signal #",(char (*) [22])&signo_local,(int *)0x23f9db,
             (char (*) [3])&local_160,(char **)0x252faf,(char (*) [9])&local_178,
             (String *)&local_140,(String *)&local_17d,pcVar2);
  Array<char>::~Array(&local_140);
  Array<char>::~Array(&local_178);
  FdOutputStream::FdOutputStream((FdOutputStream *)&local_178,2);
  pcVar2 = (char *)message.content.size_;
  if (message.content.size_ != 0) {
    pcVar2 = message.content.ptr;
  }
  __buf = (void *)0x0;
  if (message.content.size_ != 0) {
    __buf = (void *)(message.content.size_ - 1);
  }
  FdOutputStream::write((FdOutputStream *)&local_178,(int)pcVar2,__buf,(size_t)__n);
  FdOutputStream::~FdOutputStream((FdOutputStream *)&local_178);
  _exit(1);
}

Assistant:

void crashHandler(int signo, siginfo_t* info, void* context) {
  void* traceSpace[32];

  // ignoreCount = 2 to ignore crashHandler() and signal trampoline.
  auto trace = getStackTrace(traceSpace, 2);

  auto message = kj::str("*** Received signal #", signo, ": ", strsignal(signo),
                         "\nstack: ", stringifyStackTraceAddresses(trace),
                         stringifyStackTrace(trace), '\n');

  FdOutputStream(STDERR_FILENO).write(message.begin(), message.size());
  _exit(1);
}